

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

int pressure_relief(gen_ctx_t gen_ctx)

{
  MIR_context_t ctx_00;
  MIR_func_t func_00;
  MIR_insn_t_conflict insn_00;
  long *plVar1;
  int iVar2;
  bb_insn_t_conflict pbVar3;
  bb_t_conflict local_60;
  bb_t_conflict bb;
  int moved_p;
  ssa_edge_t_conflict se;
  loop_node_t_conflict loop;
  bb_insn_t_conflict use;
  bb_insn_t_conflict next_bb_insn;
  bb_insn_t_conflict bb_insn;
  MIR_insn_t insn;
  MIR_func_t func;
  MIR_context_t ctx;
  gen_ctx_t gen_ctx_local;
  
  ctx_00 = gen_ctx->ctx;
  func_00 = (gen_ctx->curr_func_item->u).func;
  bb._4_4_ = 0;
  if ((gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
    fprintf((FILE *)gen_ctx->debug_file,"+++++++++++++Pressure Relief:\n");
  }
  local_60 = DLIST_bb_t_head(&gen_ctx->curr_cfg->bbs);
  do {
    if (local_60 == (bb_t_conflict)0x0) {
      return bb._4_4_;
    }
    pbVar3 = DLIST_bb_insn_t_head(&local_60->bb_insns);
LAB_0013948d:
    next_bb_insn = pbVar3;
    if (next_bb_insn != (bb_insn_t_conflict)0x0) {
      pbVar3 = DLIST_bb_insn_t_next(next_bb_insn);
      insn_00 = next_bb_insn->insn;
      iVar2 = move_code_p((MIR_insn_code_t)*(undefined8 *)&insn_00->field_0x18);
      if (((((iVar2 != 0) && ((*(ushort *)&insn_00->ops[0].field_0x8 & 0xff) == 2)) &&
           (((ulong)insn_00[1].insn_link.prev & 0xff) != 2)) &&
          ((((ulong)insn_00[1].insn_link.prev & 0xff) != 0xb &&
           (plVar1 = (long *)insn_00->ops[0].data, plVar1 != (long *)0x0)))) &&
         ((plVar1[4] == 0 &&
          ((plVar1 = (long *)*plVar1, (bb_t_conflict)plVar1[6] != local_60 &&
           ((int)*(undefined8 *)(*plVar1 + 0x18) != 0xba)))))) {
        if (*(long *)(plVar1[6] + 0x98) != 0) {
          for (se = *(ssa_edge_t_conflict *)(*(long *)(plVar1[6] + 0x98) + 0x18);
              (se != (ssa_edge_t_conflict)0x0 && ((loop_node_t)se != local_60->loop_node->parent));
              se = se->prev_use) {
          }
          if (se != (ssa_edge_t_conflict)0x0) goto LAB_0013948d;
        }
        if ((gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
          fprintf((FILE *)gen_ctx->debug_file,"  Move insn %-5lu",(ulong)next_bb_insn->index);
          MIR_output_insn(ctx_00,gen_ctx->debug_file,insn_00,func_00,0);
          fprintf((FILE *)gen_ctx->debug_file,"  before insn %-5lu",
                  (ulong)*(uint *)((long)plVar1 + 0xc));
          MIR_output_insn(ctx_00,gen_ctx->debug_file,(MIR_insn_t_conflict)*plVar1,func_00,1);
        }
        gen_move_insn_before(gen_ctx,(MIR_insn_t)*plVar1,insn_00);
        bb._4_4_ = 1;
      }
      goto LAB_0013948d;
    }
    local_60 = DLIST_bb_t_next(local_60);
  } while( true );
}

Assistant:

static int pressure_relief (gen_ctx_t gen_ctx) {
  MIR_context_t ctx = gen_ctx->ctx;
  MIR_func_t func = curr_func_item->u.func;
  MIR_insn_t insn;
  bb_insn_t bb_insn, next_bb_insn, use;
  loop_node_t loop;
  ssa_edge_t se;
  int moved_p = FALSE;

  DEBUG (2, { fprintf (debug_file, "+++++++++++++Pressure Relief:\n"); });
  for (bb_t bb = DLIST_HEAD (bb_t, curr_cfg->bbs); bb != NULL; bb = DLIST_NEXT (bb_t, bb))
    for (bb_insn = DLIST_HEAD (bb_insn_t, bb->bb_insns); bb_insn != NULL; bb_insn = next_bb_insn) {
      next_bb_insn = DLIST_NEXT (bb_insn_t, bb_insn);
      insn = bb_insn->insn;
      if (!move_code_p (insn->code) || insn->ops[0].mode != MIR_OP_VAR
          || insn->ops[1].mode == MIR_OP_VAR || insn->ops[1].mode == MIR_OP_VAR_MEM
          || (se = insn->ops[0].data) == NULL || se->next_use != NULL || (use = se->use)->bb == bb
          || use->insn->code == MIR_PHI)
        continue;
      if ((loop = use->bb->loop_node) != NULL) {
        for (loop = loop->parent; loop != NULL; loop = loop->parent)
          if (loop == bb->loop_node->parent) break;
        if (loop != NULL) continue; /* avoid move into a loop */
      }
      /* One use in another BB: move closer */
      DEBUG (2, {
        fprintf (debug_file, "  Move insn %-5lu", (unsigned long) bb_insn->index);
        MIR_output_insn (ctx, debug_file, insn, func, FALSE);
        fprintf (debug_file, "  before insn %-5lu", (unsigned long) use->index);
        MIR_output_insn (ctx, debug_file, use->insn, func, TRUE);
      });
      gen_move_insn_before (gen_ctx, use->insn, insn);
      moved_p = TRUE;
    }
  return moved_p;
}